

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_hijack(nni_http_conn *conn)

{
  long lVar1;
  void *pvVar2;
  nni_http_server *s;
  http_sconn *sc;
  nni_http_conn *conn_local;
  
  pvVar2 = nni_http_conn_get_ctx(conn);
  if (pvVar2 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar2 + 0x18);
    nni_http_conn_set_ctx(conn,(void *)0x0);
    nni_mtx_lock((nni_mtx *)(lVar1 + 0xd0));
    *(undefined8 *)((long)pvVar2 + 0x10) = 0;
    nni_mtx_unlock((nni_mtx *)(lVar1 + 0xd0));
  }
  return NNG_OK;
}

Assistant:

nng_err
nni_http_hijack(nni_http_conn *conn)
{
	http_sconn *sc;

	sc = nni_http_conn_get_ctx(conn);
	if (sc != NULL) {
		nni_http_server *s = sc->server;
		nni_http_conn_set_ctx(conn, NULL);

		nni_mtx_lock(&s->mtx);
		sc->conn = NULL;
		nni_mtx_unlock(&s->mtx);
	}
	return (NNG_OK);
}